

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costSecondPartialDerivativeWRTControl
          (QuadraticLikeCost *this,double time,VectorDynSize *param_2,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  element_type *peVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  bool isValid;
  ostringstream errorMsg;
  char local_1d1;
  double local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = time;
  uVar3 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)partialDerivative,uVar3);
  peVar1 = (this->m_timeVaryingControlHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    iDynTree::MatrixDynSize::zero();
LAB_0016485c:
    bVar2 = true;
  }
  else {
    local_1d1 = '\0';
    (*peVar1->_vptr_TimeVaryingObject[2])(local_1d0,peVar1,&local_1d1);
    if (local_1d1 == '\0') {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to retrieve a valid control hessian at time: ",0x34);
      poVar10 = std::ostream::_M_insert<double>(local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",(char *)local_1c8);
    }
    else {
      lVar4 = iDynTree::MatrixDynSize::rows();
      lVar5 = iDynTree::MatrixDynSize::cols();
      if (lVar4 == lVar5) {
        lVar4 = iDynTree::MatrixDynSize::rows();
        lVar5 = iDynTree::VectorDynSize::size();
        if (lVar4 == lVar5) {
          lVar4 = iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          local_1d0 = (double)iDynTree::MatrixDynSize::cols();
          pdVar6 = (double *)iDynTree::MatrixDynSize::data();
          iDynTree::MatrixDynSize::rows();
          lVar5 = iDynTree::MatrixDynSize::cols();
          lVar7 = iDynTree::MatrixDynSize::data();
          lVar8 = iDynTree::MatrixDynSize::rows();
          lVar9 = iDynTree::MatrixDynSize::cols();
          if (0 < lVar8) {
            lVar11 = 0;
            do {
              if (0 < lVar9) {
                lVar13 = 0;
                pdVar12 = pdVar6;
                do {
                  *(double *)(lVar7 + lVar13 * 8) =
                       (*(double *)(lVar4 + lVar13 * 8) + *pdVar12) * 0.5;
                  lVar13 = lVar13 + 1;
                  pdVar12 = pdVar12 + lVar5;
                } while (lVar9 != lVar13);
              }
              lVar11 = lVar11 + 1;
              pdVar6 = pdVar6 + 1;
              lVar4 = lVar4 + (long)local_1d0 * 8;
              lVar7 = lVar7 + lVar9 * 8;
            } while (lVar11 != lVar8);
          }
          goto LAB_0016485c;
        }
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The hessian at time: ",0x15);
        poVar10 = std::ostream::_M_insert<double>(local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," does not match the control dimension.",0x26);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",(char *)local_1c8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The control hessian at time: ",0x1d);
        poVar10 = std::ostream::_M_insert<double>(local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," is not squared.",0x10);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("QuadraticLikeCost","costSecondPartialDerivativeWRTControl",(char *)local_1c8);
      }
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QuadraticLikeCost::costSecondPartialDerivativeWRTControl(double time,
                                                                  const iDynTree::VectorDynSize& /*state*/,
                                                                  const iDynTree::VectorDynSize& control,
                                                                  iDynTree::MatrixDynSize& partialDerivative)
        {
            partialDerivative.resize(control.size(), control.size());

            if (m_timeVaryingControlHessian) {

                bool isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) = 0.5 * (toEigen(hessian) + toEigen(hessian).transpose());
            } else {
                partialDerivative.zero();
            }
            return true;
        }